

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d3d8.cpp
# Opt level: O3

void rw::d3d8::instance(ObjPipeline *rwpipe,Atomic *atomic)

{
  ushort uVar1;
  uint32 uVar2;
  uint32 uVar3;
  Geometry *pGVar4;
  MeshHeader *pMVar5;
  long lVar6;
  InstanceDataHeader *pIVar7;
  uint32 *minVert;
  void *indexBuffer;
  uint16 *__dest;
  MeshHeader *pMVar8;
  long lVar9;
  uint uVar10;
  
  pGVar4 = atomic->geometry;
  if (pGVar4->instData == (InstanceDataHeader *)0x0) {
    allocLocation =
         "file: /workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/d3d/d3d8.cpp line: 260"
    ;
    pIVar7 = (InstanceDataHeader *)(*DAT_00149de8)(0x10,0x3000f);
    pMVar5 = pGVar4->meshHeader;
    pGVar4->instData = pIVar7;
    pIVar7->platform = 8;
    *(uint16 *)&pIVar7[1].platform = pMVar5->serialNum;
    uVar1 = pMVar5->numMeshes;
    *(ushort *)((long)&pIVar7[1].platform + 2) = uVar1;
    allocLocation =
         "file: /workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/d3d/d3d8.cpp line: 267"
    ;
    minVert = (uint32 *)(*DAT_00149de8)((ulong)uVar1 * 0x38,0x3000f);
    *(uint32 **)(pIVar7 + 2) = minVert;
    if (*(short *)((long)&pIVar7[1].platform + 2) != 0) {
      pMVar8 = pMVar5 + 1;
      uVar10 = 0;
      do {
        findMinVertAndNumVertices
                  (*(uint16 **)pMVar8,pMVar8->totalIndices,minVert,(int32 *)(minVert + 2));
        uVar2 = pMVar8->totalIndices;
        minVert[3] = uVar2;
        *(long *)(minVert + 4) = *(long *)(pMVar8 + 1);
        minVert[6] = 0;
        minVert[7] = pMVar5->flags == 1 | 4;
        minVert[10] = 0;
        minVert[0xb] = 0;
        *(undefined8 *)((long)minVert + 0x2f) = 0;
        indexBuffer = d3d::createIndexBuffer(uVar2 * 2,false);
        *(void **)(minVert + 8) = indexBuffer;
        __dest = d3d::lockIndices(indexBuffer,0,0,0);
        uVar2 = *minVert;
        if (uVar2 == 0) {
          memcpy(__dest,*(void **)pMVar8,(long)(int)minVert[3] * 2);
        }
        else {
          uVar3 = minVert[3];
          if (0 < (long)(int)uVar3) {
            lVar6 = *(long *)pMVar8;
            lVar9 = 0;
            do {
              __dest[lVar9] = *(short *)(lVar6 + lVar9 * 2) - (short)uVar2;
              lVar9 = lVar9 + 1;
            } while ((int)uVar3 != lVar9);
          }
        }
        d3d::unlockIndices(*(void **)(minVert + 8));
        (**(code **)&rwpipe[1].super_Pipeline)(pGVar4,minVert);
        pMVar8 = (MeshHeader *)&pMVar8[1].totalIndices;
        minVert = minVert + 0xe;
        uVar10 = uVar10 + 1;
      } while (uVar10 < *(ushort *)((long)&pIVar7[1].platform + 2));
    }
  }
  return;
}

Assistant:

static void
instance(rw::ObjPipeline *rwpipe, Atomic *atomic)
{
	ObjPipeline *pipe = (ObjPipeline*)rwpipe;
	Geometry *geo = atomic->geometry;
	// TODO: allow for REINSTANCE
	if(geo->instData)
		return;
	InstanceDataHeader *header = rwNewT(InstanceDataHeader, 1, MEMDUR_EVENT | ID_GEOMETRY);
	MeshHeader *meshh = geo->meshHeader;
	geo->instData = header;
	header->platform = PLATFORM_D3D8;

	header->serialNumber = meshh->serialNum;
	header->numMeshes = meshh->numMeshes;
	header->inst = rwNewT(InstanceData, header->numMeshes, MEMDUR_EVENT | ID_GEOMETRY);

	InstanceData *inst = header->inst;
	Mesh *mesh = meshh->getMeshes();
	for(uint32 i = 0; i < header->numMeshes; i++){
		findMinVertAndNumVertices(mesh->indices, mesh->numIndices,
		                          &inst->minVert, &inst->numVertices);
		inst->numIndices = mesh->numIndices;
		inst->material = mesh->material;
		inst->vertexShader = 0;
		inst->primType = meshh->flags == 1 ? D3DPT_TRIANGLESTRIP : D3DPT_TRIANGLELIST;
		inst->vertexBuffer = nil;
		inst->baseIndex = 0;	// (maybe) not used by us
		inst->vertexAlpha = 0;
		inst->managed = 0;
		inst->remapped = 0;

		inst->indexBuffer = createIndexBuffer(inst->numIndices*2, false);
		uint16 *indices = lockIndices(inst->indexBuffer, 0, 0, 0);
		if(inst->minVert == 0)
			memcpy(indices, mesh->indices, inst->numIndices*2);
		else
			for(int32 j = 0; j < inst->numIndices; j++)
				indices[j] = mesh->indices[j] - inst->minVert;
		unlockIndices(inst->indexBuffer);

		pipe->instanceCB(geo, inst);
		mesh++;
		inst++;
	}
}